

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O1

void __thiscall Curve::findSegment(Curve *this,double xseg,double *slope,double *intercept)

{
  double *pdVar1;
  pointer pdVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  
  pdVar1 = (this->xData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(this->xData).super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pdVar1) >> 3);
  if (uVar3 == 1) {
    *intercept = 0.0;
    dVar7 = *pdVar1;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      *slope = *(this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start / dVar7;
    }
    else {
      *slope = 0.0;
    }
  }
  else {
    iVar5 = uVar3 - 1;
    if (1 < (int)uVar3) {
      uVar6 = 1;
      do {
        if (xseg <= pdVar1[uVar6]) {
          iVar5 = (int)uVar6;
          break;
        }
        uVar6 = uVar6 + 1;
      } while ((uVar3 & 0x7fffffff) != uVar6);
    }
    lVar4 = (long)iVar5;
    pdVar2 = (this->yData).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar7 = (pdVar2[lVar4] - pdVar2[lVar4 + -1]) / (pdVar1[lVar4] - pdVar1[lVar4 + -1]);
    *slope = dVar7;
    *intercept = pdVar2[lVar4] - dVar7 * pdVar1[lVar4];
  }
  return;
}

Assistant:

void Curve::findSegment(double xseg, double& slope, double& intercept)
{
    int n = xData.size();
    int segment = n-1;

    if (n == 1)
    {
        intercept = 0.0;
        if (xData[0] == 0.0) slope = 0.0;
        else slope = yData[0] / xData[0];
    }

    else
    {
        for (int i = 1; i < n; i++)
        {
            if (xseg <= xData[i])
            {
                segment = i;
                break;
            }
        }
        slope = (yData[segment] - yData[segment-1]) /
                (xData[segment] - xData[segment-1]);
        intercept = yData[segment] - slope * xData[segment];
    }
}